

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyForTypeOfScoped<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ImplicitCallFlags IVar1;
  uint uVar2;
  uint uVar3;
  InlineCacheIndex inlineCacheIndex;
  ThreadContext *this_00;
  ScriptContext *requestContext;
  InlineCache *pIVar4;
  FunctionBody *functionBody;
  code *pcVar5;
  bool bVar6;
  PropertyId PVar7;
  FrameDisplay *pFVar8;
  undefined4 *puVar9;
  void *propertyObject;
  Var pvVar10;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  Var value;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  PVar7 = FunctionBody::GetPropertyIdFromCacheId
                    (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  if ((~*(ushort *)(*(long *)(this + 0x88) + 0x45) & 0x1100) == 0) {
    pFVar8 = GetLocalFrameDisplay(this);
  }
  else {
    pFVar8 = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  uVar2 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar6) goto LAB_00a676a9;
    *puVar9 = 0;
  }
  if (*(uint *)(this + 200) <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar6) goto LAB_00a676a9;
    *puVar9 = 0;
  }
  if (pFVar8->length == 1) {
    requestContext = *(ScriptContext **)(this + 0x78);
    pIVar4 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar2 * 8);
    propertyObject = FrameDisplay::GetItem(pFVar8,0);
    local_a0 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_a0,*(FunctionBody **)(this + 0x88),pIVar4,
               playout->inlineCacheIndex,true);
    if (info._8_8_ == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                  ,0x21,
                                  "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())"
                                  ,"IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()"
                                 );
      if (!bVar6) goto LAB_00a676a9;
      *puVar9 = 0;
    }
    if (info.inlineCache != (InlineCache *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                  ,0x22,
                                  "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                  ,
                                  "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                                 );
      if (!bVar6) goto LAB_00a676a9;
      *puVar9 = 0;
    }
    bVar6 = InlineCache::TryGetProperty<true,false,false,false,false,false>
                      ((InlineCache *)info._8_8_,propertyObject,(RecyclableObject *)propertyObject,
                       PVar7,(Var *)&info.inlineCacheIndex,requestContext,
                       (PropertyCacheOperationInfo *)0x0);
    if (bVar6) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
      SetReg<unsigned_int>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  uVar2 = playout->Value;
  uVar3 = playout->inlineCacheIndex;
  functionBody = *(FunctionBody **)(this + 0x88);
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar6) goto LAB_00a676a9;
    *puVar9 = 0;
  }
  if (*(uint *)(this + 200) <= uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar6) {
LAB_00a676a9:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  pIVar4 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar3 * 8);
  inlineCacheIndex = playout->inlineCacheIndex;
  if ((~*(ushort *)(*(long *)(this + 0x88) + 0x45) & 0x1100) == 0) {
    pFVar8 = GetLocalFrameDisplay(this);
  }
  else {
    pFVar8 = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  PVar7 = FunctionBody::GetPropertyIdFromCacheId
                    (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  pvVar10 = *(Var *)(this + 0x168);
  ValidateRegValue(this,pvVar10,false,true);
  pvVar10 = JavascriptOperators::PatchGetPropertyForTypeOfScoped<false,Js::InlineCache>
                      (functionBody,pIVar4,inlineCacheIndex,pFVar8,PVar7,pvVar10);
  SetReg<unsigned_int>(this,uVar2,pvVar10);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyForTypeOfScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(0);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyForTypeOfScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                GetReg(Js::FunctionBody::RootObjectRegSlot)));

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }